

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

Layer * ncnn::ConvolutionDepthWise_layer_creator(void)

{
  Layer *pLVar1;
  ConvolutionDepthWise *in_stack_00000010;
  
  pLVar1 = (Layer *)operator_new(0x1d0);
  ConvolutionDepthWise::ConvolutionDepthWise(in_stack_00000010);
  return pLVar1;
}

Assistant:

ConvolutionDepthWise::ConvolutionDepthWise()
{
    one_blob_only = true;
    support_inplace = false;
}